

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAnneal.c
# Opt level: O0

Move * ddJumpingUp(DdManager *table,int x,int x_low,int initial_size)

{
  Move *pMVar1;
  int iVar2;
  DdNode *pDVar3;
  int local_44;
  int limit_size;
  int size;
  int y;
  Move *move;
  Move *moves;
  int initial_size_local;
  int x_low_local;
  int x_local;
  DdManager *table_local;
  
  move = (Move *)0x0;
  limit_size = cuddNextLow(table,x);
  local_44 = initial_size;
  initial_size_local = x;
  while( true ) {
    if (limit_size < x_low) {
      return move;
    }
    iVar2 = cuddSwapInPlace(table,limit_size,initial_size_local);
    if ((iVar2 == 0) || (pDVar3 = cuddDynamicAllocNode(table), pDVar3 == (DdNode *)0x0)) break;
    pDVar3->index = limit_size;
    pDVar3->ref = initial_size_local;
    *(int *)((long)&pDVar3->next + 4) = iVar2;
    (pDVar3->type).kids.T = (DdNode *)move;
    if (table->maxGrowth * (double)local_44 < (double)iVar2) {
      return (Move *)pDVar3;
    }
    if (iVar2 < local_44) {
      local_44 = iVar2;
    }
    initial_size_local = limit_size;
    limit_size = cuddNextLow(table,limit_size);
    move = (Move *)pDVar3;
  }
  while (move != (Move *)0x0) {
    pMVar1 = move->next;
    move->y = 0;
    *(DdNode **)&move->flags = table->nextFree;
    table->nextFree = (DdNode *)move;
    move = pMVar1;
  }
  return (Move *)0x0;
}

Assistant:

static Move *
ddJumpingUp(
  DdManager * table,
  int  x,
  int  x_low,
  int  initial_size)
{
    Move       *moves;
    Move       *move;
    int        y;
    int        size;
    int        limit_size = initial_size;

    moves = NULL;
    y = cuddNextLow(table,x);
    while (y >= x_low) {
        size = cuddSwapInPlace(table,y,x);
        if (size == 0) goto ddJumpingUpOutOfMem;
        move = (Move *)cuddDynamicAllocNode(table);
        if (move == NULL) goto ddJumpingUpOutOfMem;
        move->x = y;
        move->y = x;
        move->size = size;
        move->next = moves;
        moves = move;
        if ((double) size > table->maxGrowth * (double) limit_size) {
            break;
        } else if (size < limit_size) {
            limit_size = size;
        }
        x = y;
        y = cuddNextLow(table,x);
    }
    return(moves);

ddJumpingUpOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(NULL);

}